

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void __thiscall iqnet::ssl::exception::exception(exception *this)

{
  ulong e;
  char *__s;
  allocator<char> local_9;
  
  *(undefined ***)this = &PTR__exception_0019e838;
  e = ERR_get_error();
  this->ssl_err = e;
  __s = ERR_reason_error_string(e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,__s,&local_9);
  std::__cxx11::string::insert((ulong)&this->msg,(char *)0x0);
  return;
}

Assistant:

exception::exception() throw():
  ssl_err( ERR_get_error() ),
  msg( ERR_reason_error_string(ssl_err) )
{
  msg.insert(0, "SSL: ");
}